

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::SimpleAtod(lts_20250127 *this,string_view str,Nonnull<double_*> out)

{
  undefined1 auVar1 [16];
  double *value;
  char *pcVar2;
  size_t sVar3;
  Nonnull<const_char_*> last;
  double dVar4;
  string_view sVar5;
  from_chars_result fVar6;
  string_view str_00;
  
  value = (double *)str._M_str;
  str_00._M_str = (char *)str._M_len;
  *value = 0.0;
  str_00._M_len = (size_t)this;
  sVar5 = StripAsciiWhitespace(str_00);
  pcVar2 = sVar5._M_str;
  if (sVar5._M_len != 0) {
    if (*pcVar2 != '+') goto LAB_002608ca;
    pcVar2 = pcVar2 + 1;
    sVar3 = sVar5._M_len - 1;
    sVar5._M_str = pcVar2;
    sVar5._M_len = sVar3;
    if (sVar3 != 0) {
      if (*pcVar2 == '-') {
        return false;
      }
      goto LAB_002608ca;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pcVar2;
  sVar5 = (string_view)(auVar1 << 0x40);
LAB_002608ca:
  last = sVar5._M_str + sVar5._M_len;
  fVar6 = from_chars(sVar5._M_str,last,value,general);
  if (fVar6.ptr != last || fVar6.ec == invalid_argument) {
    return false;
  }
  if (fVar6.ec == result_out_of_range) {
    if (*value <= 1.0) {
      if (-1.0 <= *value) {
        return true;
      }
      dVar4 = -INFINITY;
    }
    else {
      dVar4 = INFINITY;
    }
    *value = dVar4;
    return true;
  }
  return true;
}

Assistant:

bool SimpleAtod(absl::string_view str, absl::Nonnull<double*> out) {
  *out = 0.0;
  str = StripAsciiWhitespace(str);
  // std::from_chars doesn't accept an initial +, but SimpleAtod does, so if one
  // is present, skip it, while avoiding accepting "+-0" as valid.
  if (!str.empty() && str[0] == '+') {
    str.remove_prefix(1);
    if (!str.empty() && str[0] == '-') {
      return false;
    }
  }
  auto result = absl::from_chars(str.data(), str.data() + str.size(), *out);
  if (result.ec == std::errc::invalid_argument) {
    return false;
  }
  if (result.ptr != str.data() + str.size()) {
    // not all non-whitespace characters consumed
    return false;
  }
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (*out > 1.0) {
      *out = std::numeric_limits<double>::infinity();
    } else if (*out < -1.0) {
      *out = -std::numeric_limits<double>::infinity();
    }
  }
  return true;
}